

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qshl_u64_arm(CPUARMState *env,uint64_t val,uint64_t shiftop)

{
  byte bVar1;
  uint64_t tmp;
  int8_t shift;
  uint64_t shiftop_local;
  uint64_t val_local;
  CPUARMState *env_local;
  
  bVar1 = (byte)shiftop;
  if ((char)bVar1 < '@') {
    if ((char)bVar1 < -0x3f) {
      shiftop_local = 0;
    }
    else if ((char)bVar1 < '\0') {
      shiftop_local = val >> (-bVar1 & 0x3f);
    }
    else {
      shiftop_local = val << (bVar1 & 0x3f);
      if (shiftop_local >> (bVar1 & 0x3f) != val) {
        (env->vfp).qc[0] = 1;
        shiftop_local = 0xffffffffffffffff;
      }
    }
  }
  else {
    shiftop_local = val;
    if (val != 0) {
      shiftop_local = 0xffffffffffffffff;
      (env->vfp).qc[0] = 1;
    }
  }
  return shiftop_local;
}

Assistant:

uint64_t HELPER(neon_qshl_u64)(CPUARMState *env, uint64_t val, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    if (shift >= 64) {
        if (val) {
            val = ~(uint64_t)0;
            SET_QC();
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        uint64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = ~(uint64_t)0;
        }
    }
    return val;
}